

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decrypt.c
# Opt level: O2

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  uint16_t uVar1;
  gf gVar2;
  long lVar3;
  ushort uVar4;
  ulong uVar5;
  gf g [65];
  gf s_cmp [128];
  gf s [128];
  gf locator [65];
  uchar r [436];
  gf images [3488];
  
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 1) {
    r[lVar3] = *(uchar *)((long)outlen + lVar3);
  }
  for (lVar3 = 0x60; lVar3 != 0x1b4; lVar3 = lVar3 + 1) {
    r[lVar3] = '\0';
  }
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 2) {
    uVar1 = load2(out + lVar3);
    *(uint16_t *)((long)g + lVar3) = uVar1 & 0xfff;
  }
  g[0x40] = 1;
  synd(s,g,(gf *)in,r);
  bm(locator,s);
  root(images,locator,(gf *)in);
  for (lVar3 = 0; lVar3 != 0x1b4; lVar3 = lVar3 + 1) {
    ctx[lVar3] = (EVP_PKEY_CTX)0x0;
  }
  uVar4 = 0;
  for (uVar5 = 0; uVar5 != 0xda0; uVar5 = uVar5 + 1) {
    gVar2 = gf_iszero(images[uVar5]);
    uVar4 = uVar4 + (gVar2 & 1);
    ctx[uVar5 >> 3 & 0x1fffffff] =
         (EVP_PKEY_CTX)((byte)ctx[uVar5 >> 3 & 0x1fffffff] | (char)(gVar2 & 1) << ((byte)uVar5 & 7))
    ;
  }
  synd(s_cmp,g,(gf *)in,(uchar *)ctx);
  uVar4 = uVar4 ^ 0x40;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    uVar4 = uVar4 | s_cmp[lVar3] ^ s[lVar3];
  }
  return (uint)((ushort)-uVar4 >> 0xf);
}

Assistant:

int decrypt(unsigned char *e, const unsigned char *sk, const unsigned char *c, gf *L)
{
  int i, w = 0;
  uint16_t check;

  unsigned char r[ SYS_N/8 ];

  gf g[ SYS_T+1 ];
//  gf L[ SYS_N ];

  gf s[ SYS_T*2 ];
  gf s_cmp[ SYS_T*2 ];
  gf locator[ SYS_T+1 ];
  gf images[ SYS_N ];

  gf t;

  //

  for (i = 0; i < SYND_BYTES; i++)       r[i] = c[i];
  for (i = SYND_BYTES; i < SYS_N/8; i++) r[i] = 0;

  for (i = 0; i < SYS_T; i++) { g[i] = load2(sk); g[i] &= GFMASK; sk += 2; } g[ SYS_T ] = 1;

  //support_gen(L, sk);

  synd(s, g, L, r);

  bm(locator, s);

  root(images, locator, L);

  //

  for (i = 0; i < SYS_N/8; i++)
    e[i] = 0;

  for (i = 0; i < SYS_N; i++)
  {
    t = gf_iszero(images[i]) & 1;

    e[ i/8 ] |= t << (i%8);
    w += t;

  }

#ifdef KAT
  {
    int k;
    printf("decrypt e: positions");
    for (k = 0;k < SYS_N;++k)
      if (e[k/8] & (1 << (k&7)))
        printf(" %d",k);
    printf("\n");
  }
#endif

  synd(s_cmp, g, L, e);

  //

  check = w;
  check ^= SYS_T;

  for (i = 0; i < SYS_T*2; i++)
    check |= s[i] ^ s_cmp[i];

  check -= 1;
  check >>= 15;

  return check ^ 1;
}